

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,void *this,allocator<char> *__a)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *this;
  lVar2 = *(long *)((long)this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

size_type copy(_CharT* __s, size_type __n, size_type __pos = 0) const
        {
            if ( __pos > size())
                __LIBCPP_STRVIEWCLONE_throw(std::out_of_range("string_view::copy"));
            size_type __rlen = std::min( __n, size() - __pos );
            std::copy_n(begin() + __pos, __rlen, __s );
            return __rlen;
        }